

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2max_distance_targets.cc
# Opt level: O0

bool __thiscall
S2MaxDistanceShapeIndexTarget::UpdateMinDistance
          (S2MaxDistanceShapeIndexTarget *this,S2Cell *cell,S2MaxDistance *min_dist)

{
  int32 iVar1;
  pointer pSVar2;
  Options *this_00;
  S1ChordAngle SVar3;
  Result RVar4;
  S2MaxDistance local_98;
  undefined4 local_90;
  undefined1 local_80 [8];
  Result r;
  CellTarget target;
  S2MaxDistance *min_dist_local;
  S2Cell *cell_local;
  S2MaxDistanceShapeIndexTarget *this_local;
  
  pSVar2 = std::unique_ptr<S2FurthestEdgeQuery,_std::default_delete<S2FurthestEdgeQuery>_>::
           operator->(&this->query_);
  this_00 = S2FurthestEdgeQuery::mutable_options(pSVar2);
  SVar3 = S2MaxDistance::operator_cast_to_S1ChordAngle(min_dist);
  S2FurthestEdgeQuery::Options::set_min_distance(this_00,SVar3);
  S2FurthestEdgeQuery::CellTarget::CellTarget((CellTarget *)&r.shape_id_,cell);
  pSVar2 = std::unique_ptr<S2FurthestEdgeQuery,_std::default_delete<S2FurthestEdgeQuery>_>::
           operator->(&this->query_);
  RVar4 = S2FurthestEdgeQuery::FindFurthestEdge(pSVar2,(Target *)&r.shape_id_);
  r.distance_.length2_ = RVar4._8_8_;
  local_80 = (undefined1  [8])RVar4.distance_.length2_;
  iVar1 = S2FurthestEdgeQuery::Result::shape_id((Result *)local_80);
  if (-1 < iVar1) {
    SVar3 = S2FurthestEdgeQuery::Result::distance((Result *)local_80);
    S2MaxDistance::S2MaxDistance(&local_98,SVar3);
    (min_dist->distance_).length2_ = (double)local_98;
  }
  local_90 = 1;
  S2FurthestEdgeQuery::CellTarget::~CellTarget((CellTarget *)&r.shape_id_);
  return -1 < iVar1;
}

Assistant:

bool S2MaxDistanceShapeIndexTarget::UpdateMinDistance(
    const S2Cell& cell, S2MaxDistance* min_dist) {
  query_->mutable_options()->set_min_distance(S1ChordAngle(*min_dist));
  S2FurthestEdgeQuery::CellTarget target(cell);
  S2FurthestEdgeQuery::Result r = query_->FindFurthestEdge(&target);
  if (r.shape_id() < 0) return false;
  *min_dist = S2MaxDistance(r.distance());
  return true;
}